

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mecab.cpp
# Opt level: O1

int Mecab_analysis(Mecab *m,char *str)

{
  long *plVar1;
  char cVar2;
  long lVar3;
  char **ppcVar4;
  char *pcVar5;
  undefined8 *puVar6;
  int iVar7;
  int iVar8;
  string f;
  char *local_50 [2];
  char local_40 [16];
  
  iVar7 = 0;
  iVar8 = 0;
  if ((((m->model != (void *)0x0) && (iVar8 = iVar7, m->tagger != (void *)0x0)) &&
      (str != (char *)0x0)) && (m->lattice != (void *)0x0)) {
    if ((0 < m->size) || (m->feature != (char **)0x0)) {
      Mecab_refresh(m);
    }
    puVar6 = (undefined8 *)m->tagger;
    plVar1 = (long *)m->lattice;
    (**(code **)(*plVar1 + 0x48))(plVar1,str);
    cVar2 = (**(code **)*puVar6)(puVar6,plVar1);
    puVar6 = (undefined8 *)*plVar1;
    iVar8 = 0;
    if (cVar2 != '\0') {
      for (lVar3 = (*(code *)puVar6[2])(plVar1); lVar3 != 0; lVar3 = *(long *)(lVar3 + 8)) {
        if ((*(byte *)(lVar3 + 0x4f) & 0xfe) != 2) {
          m->size = m->size + 1;
        }
      }
      if ((long)m->size == 0) {
        return 1;
      }
      ppcVar4 = (char **)calloc((long)m->size,8);
      m->feature = ppcVar4;
      lVar3 = (**(code **)(*plVar1 + 0x10))(plVar1);
      if (lVar3 != 0) {
        iVar8 = 0;
        do {
          if ((*(byte *)(lVar3 + 0x4f) & 0xfe) != 2) {
            local_50[0] = local_40;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_50,*(long *)(lVar3 + 0x30),
                       (ulong)*(ushort *)(lVar3 + 0x44) + *(long *)(lVar3 + 0x30));
            std::__cxx11::string::append((char *)local_50);
            std::__cxx11::string::append((char *)local_50);
            pcVar5 = strdup(local_50[0]);
            m->feature[iVar8] = pcVar5;
            if (local_50[0] != local_40) {
              operator_delete(local_50[0]);
            }
            iVar8 = iVar8 + 1;
          }
          lVar3 = *(long *)(lVar3 + 8);
        } while (lVar3 != 0);
      }
      puVar6 = (undefined8 *)*plVar1;
      iVar8 = 1;
    }
    (*(code *)*puVar6)(plVar1);
  }
  return iVar8;
}

Assistant:

BOOL Mecab_analysis(Mecab *m, const char *str)
{
   if(m->model == NULL || m->tagger == NULL || m->lattice == NULL || str == NULL)
      return FALSE;

   if(m->size > 0 || m->feature != NULL)
      Mecab_refresh(m);

   MeCab::Tagger *tagger = (MeCab::Tagger *) m->tagger;
   MeCab::Lattice *lattice = (MeCab::Lattice *) m->lattice;

   lattice->set_sentence(str);

   if(tagger->parse(lattice) == false) {
      lattice->clear();
      return FALSE;
   }

   for (const MeCab::Node* node = lattice->bos_node(); node; node = node->next) {
      if(node->stat != MECAB_BOS_NODE && node->stat != MECAB_EOS_NODE)
         m->size++;
   }

   if(m->size == 0)
      return TRUE;

   m->feature = (char **) calloc(m->size, sizeof(char *));
   int index = 0;
   for (const MeCab::Node* node = lattice->bos_node(); node; node = node->next) {
      if(node->stat != MECAB_BOS_NODE && node->stat != MECAB_EOS_NODE) {
         std::string f(node->surface, node->length);
         f += ",";
         f += node->feature;
         m->feature[index] = strdup(f.c_str());
         index++;
      }
   }

   lattice->clear();

   return TRUE;
}